

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
AppendAllocableHeapBlockList
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list)

{
  Recycler *pRVar1;
  code *pcVar2;
  bool bVar3;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar4;
  undefined4 *puVar5;
  
  bVar3 = Js::Phases::IsEnabled
                    (&((this->super_HeapBucket).heapInfo)->recycler->recyclerFlagsTable->Trace,
                     ConcurrentSweepPhase);
  if ((bVar3) && (DAT_0145948a == '\x01')) {
    pRVar1 = ((this->super_HeapBucket).heapInfo)->recycler;
    Output::Print(L"[GC #%d] [HeapBucket 0x%p] in AppendAllocableHeapBlockList [CollectionState: %d] \n"
                  ,(ulong)pRVar1->collectionCount,this,(ulong)(pRVar1->collectionState).value);
  }
  if (this->heapBlockList == (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0
     ) {
    this->heapBlockList = list;
  }
  else {
    pSVar4 = HeapBlockList::
             Tail<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                       (this->heapBlockList);
    if (pSVar4 == (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x738,"(tail != nullptr)","tail != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    (pSVar4->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next =
         (SmallHeapBlockT<SmallAllocationBlockAttributes> *)list;
    if (this->nextAllocableBlockHead !=
        (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      return;
    }
  }
  this->nextAllocableBlockHead = list;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::AppendAllocableHeapBlockList(TBlockType * list)
{
#ifdef RECYCLER_TRACE
    if (this->GetRecycler()->GetRecyclerFlagsTable().Trace.IsEnabled(Js::ConcurrentSweepPhase) && CONFIG_FLAG_RELEASE(Verbose))
    {
        CollectionState collectionState = this->GetRecycler()->collectionState;
        Output::Print(_u("[GC #%d] [HeapBucket 0x%p] in AppendAllocableHeapBlockList [CollectionState: %d] \n"), this->GetRecycler()->collectionCount, this, collectionState);
    }
#endif
    // Add the list to the end of the current list
    TBlockType * currentHeapBlockList = this->heapBlockList;
    if (currentHeapBlockList == nullptr)
    {
        // There weren't any heap block list before, just move the list over and start allocate from it
        this->heapBlockList = list;
        this->nextAllocableBlockHead = list;
    }
    else
    {
        // Find the last block and append the list
        TBlockType * tail = HeapBlockList::Tail(currentHeapBlockList);
        Assert(tail != nullptr);
        tail->SetNextBlock(list);

        // If we are not currently allocating from the existing heapBlockList,
        // that means fill all the exiting one already, we should start with what we just appended.
        if (this->nextAllocableBlockHead == nullptr)
        {
            this->nextAllocableBlockHead = list;
        }
    }
}